

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void functionDestroy(sqlite3 *db,FuncDef *p)

{
  int iVar1;
  
  if ((p != (FuncDef *)0x0) &&
     (*(int *)p = *(int *)p + -1, iVar1._0_2_ = p->nArg, iVar1._2_1_ = p->iPrefEnc,
     iVar1._3_1_ = p->flags, iVar1 == 0)) {
    (*(code *)p->pUserData)(p->pNext);
    sqlite3DbFree(db,p);
    return;
  }
  return;
}

Assistant:

static void functionDestroy(sqlite3 *db, FuncDef *p){
  FuncDestructor *pDestructor = p->pDestructor;
  if( pDestructor ){
    pDestructor->nRef--;
    if( pDestructor->nRef==0 ){
      pDestructor->xDestroy(pDestructor->pUserData);
      sqlite3DbFree(db, pDestructor);
    }
  }
}